

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# emit_dfa.cc
# Opt level: O0

string * re2c::genGetCondition_abi_cxx11_(void)

{
  opt_t *poVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDI;
  
  poVar1 = Opt::operator->((Opt *)&opts);
  if ((poVar1->cond_get_naked & 1U) == 0) {
    poVar1 = Opt::operator->((Opt *)&opts);
    std::operator+(in_RDI,&poVar1->cond_get,"()");
  }
  else {
    poVar1 = Opt::operator->((Opt *)&opts);
    std::__cxx11::string::string((string *)in_RDI,(string *)&poVar1->cond_get);
  }
  return in_RDI;
}

Assistant:

std::string genGetCondition()
{
	return opts->cond_get_naked
		? opts->cond_get
		: opts->cond_get + "()";
}